

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_ext(lysp_ctx *ctx,lysp_stmt *stmt,ly_stmt insubstmt,uint64_t insubstmt_index,
                    lysp_ext_instance **exts)

{
  long *plVar1;
  lysp_ext_instance *plVar2;
  lysp_ext_instance *plVar3;
  LY_ERR LVar4;
  long *plVar5;
  long lVar6;
  ly_ctx *plVar7;
  
  plVar2 = *exts;
  if (plVar2 == (lysp_ext_instance *)0x0) {
    plVar5 = (long *)malloc(0x78);
    if (plVar5 == (long *)0x0) goto LAB_00167ba5;
    *plVar5 = 1;
    lVar6 = 1;
  }
  else {
    plVar3 = plVar2[-1].exts;
    plVar2[-1].exts = (lysp_ext_instance *)((long)&plVar3->name + 1);
    plVar5 = (long *)realloc(&plVar2[-1].exts,(long)plVar3 * 0x70 + 0x78);
    if (plVar5 == (long *)0x0) {
      (*exts)[-1].exts = (lysp_ext_instance *)((long)&(*exts)[-1].exts[-1].exts + 7);
LAB_00167ba5:
      if (ctx == (lysp_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_ext");
      return LY_EMEM;
    }
    lVar6 = *plVar5;
  }
  *exts = (lysp_ext_instance *)(plVar5 + 1);
  plVar1 = plVar5 + lVar6 * 0xe;
  plVar1[-1] = 0;
  *plVar1 = 0;
  plVar1[-3] = 0;
  plVar1[-2] = 0;
  plVar1[-5] = 0;
  plVar1[-4] = 0;
  plVar1[-7] = 0;
  plVar1[-6] = 0;
  plVar1[-9] = 0;
  plVar1[-8] = 0;
  plVar1[-0xb] = 0;
  plVar1[-10] = 0;
  plVar1[-0xd] = 0;
  plVar1[-0xc] = 0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar7 = (ly_ctx *)0x0;
  }
  else {
    plVar7 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar4 = lydict_insert(plVar7,stmt->stmt,0,(char **)(plVar1 + -0xd));
  if (LVar4 == LY_SUCCESS) {
    *(ly_stmt *)(plVar5 + lVar6 * 0xe + -7) = insubstmt;
    plVar5[lVar6 * 0xe + -6] = insubstmt_index;
    plVar5[lVar6 * 0xe + -2] = 0;
    LVar4 = lysp_stmt_dup(ctx,stmt->child,(lysp_stmt **)(plVar5 + lVar6 * 0xe + -1));
    if (LVar4 == LY_SUCCESS) {
      if (stmt->arg != (char *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar4 = lydict_insert(plVar7,stmt->arg,0,(char **)(plVar5 + lVar6 * 0xe + -0xc));
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
      }
      LVar4 = LY_SUCCESS;
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lysp_stmt_ext(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, enum ly_stmt insubstmt,
        LY_ARRAY_COUNT_TYPE insubstmt_index, struct lysp_ext_instance **exts)
{
    struct lysp_ext_instance *e;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *exts, e, LY_EMEM);

    /* store name and insubstmt info */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->stmt, 0, &e->name));
    e->parent_stmt = insubstmt;
    e->parent_stmt_index = insubstmt_index;
    e->parsed = NULL;
    LY_CHECK_RET(lysp_stmt_dup(ctx, stmt->child, &e->child));

    /* get optional argument */
    if (stmt->arg) {
        LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &e->argument));
    }

    return LY_SUCCESS;
}